

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_3f5684::QDynamicBufferResourceRoot::registerSelf
          (QDynamicBufferResourceRoot *this,uchar *b,qsizetype size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  if ((ulong)size < 0x14) {
    return false;
  }
  if (*b != 'q') {
    return false;
  }
  if (b[1] != 'r') {
    return false;
  }
  if (b[2] != 'e') {
    return false;
  }
  if (b[3] != 's') {
    return false;
  }
  uVar1 = *(uint *)(b + 4);
  uVar2 = *(uint *)(b + 8);
  uVar4 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = *(uint *)(b + 0xc);
  uVar3 = *(uint *)(b + 0x10);
  lVar6 = (long)(int)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                     uVar2 << 0x18);
  lVar5 = (long)(int)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                     uVar1 << 0x18);
  lVar7 = (long)(int)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                     uVar3 << 0x18);
  if ((int)uVar4 < 3) {
    bVar8 = true;
    if (size < 0) goto LAB_00238173;
  }
  else {
    bVar8 = (*(uint *)(b + 0x14) & 0xfaffffff) == 0;
    if (size < 0) {
      if ((*(uint *)(b + 0x14) & 0xfaffffff) != 0) {
        return false;
      }
      goto LAB_00238173;
    }
  }
  if (!(bool)((lVar7 < size && (lVar5 < size && lVar6 < size)) & bVar8)) {
    return false;
  }
LAB_00238173:
  if (2 < uVar4 - 1) {
    return false;
  }
  this->buffer = b;
  (this->super_QResourceRoot).tree = b + lVar6;
  (this->super_QResourceRoot).names = b + lVar7;
  (this->super_QResourceRoot).payloads = b + lVar5;
  (this->super_QResourceRoot).version = uVar4;
  return true;
}

Assistant:

bool registerSelf(const uchar *b, qsizetype size)
    {
        // 5 int "pointers"
        if (size >= 0 && size < 20)
            return false;

        // setup the data now
        int offset = 0;

        // magic number
        if (b[offset + 0] != 'q' || b[offset + 1] != 'r' || b[offset + 2] != 'e'
            || b[offset + 3] != 's') {
            return false;
        }
        offset += 4;

        const int version = qFromBigEndian<qint32>(b + offset);
        offset += 4;

        const int tree_offset = qFromBigEndian<qint32>(b + offset);
        offset += 4;

        const int data_offset = qFromBigEndian<qint32>(b + offset);
        offset += 4;

        const int name_offset = qFromBigEndian<qint32>(b + offset);
        offset += 4;

        quint32 file_flags = 0;
        if (version >= 3) {
            file_flags = qFromBigEndian<qint32>(b + offset);
            offset += 4;
        }

        // Some sanity checking for sizes. This is _not_ a security measure.
        if (size >= 0 && (tree_offset >= size || data_offset >= size || name_offset >= size))
            return false;

        // And some sanity checking for features
        quint32 acceptableFlags = 0;
#ifndef QT_NO_COMPRESS
        acceptableFlags |= Compressed;
#endif
        if (QT_CONFIG(zstd))
            acceptableFlags |= CompressedZstd;
        if (file_flags & ~acceptableFlags)
            return false;

        if (version >= 0x01 && version <= 0x03) {
            buffer = b;
            setSource(version, b + tree_offset, b + name_offset, b + data_offset);
            return true;
        }
        return false;
    }